

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O1

double __thiscall
Trainer::Trainer<Kuhn::Game>::externalSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex)

{
  uint8_t *__param;
  long lVar1;
  undefined8 obj;
  bool bVar2;
  uint actionNum;
  int iVar3;
  result_type action;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *__wbegin;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 *puStack_120;
  undefined1 local_118 [8];
  Game game_cp;
  discrete_distribution<int> dist;
  string infoSet;
  double local_40;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  puStack_120 = (undefined1 *)0x11378a;
  bVar2 = Kuhn::Game::done(game);
  if (bVar2) {
    dVar7 = Kuhn::Game::payoff(game,playerIndex);
    return dVar7;
  }
  puStack_120 = (undefined1 *)0x1137b3;
  Kuhn::Game::infoSetStr_abi_cxx11_
            ((string *)
             &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,game);
  puStack_120 = (undefined1 *)0x1137bb;
  actionNum = Kuhn::Game::actionNum(game);
  puStack_120 = (undefined1 *)0x1137c6;
  iVar3 = Kuhn::Game::currentPlayer(game);
  if (this->mUpdate[iVar3] == false) {
    puStack_120 = &LAB_00113a1f;
    __assert_fail("mUpdate[player] && \"External sampling with stochastically-weighted averaging cannot treat static player.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                  ,0x1e2,
                  "double Trainer::Trainer<Kuhn::Game>::externalSamplingCFR(const T &, const int) [T = Kuhn::Game]"
                 );
  }
  puStack_120 = (undefined1 *)0x1137f2;
  ppNVar4 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->mNodeMap,
                         (key_type *)
                         &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = *ppNVar4;
  if (this_00 == (mapped_type)0x0) {
    puStack_120 = (undefined1 *)0x113804;
    this_00 = (mapped_type)operator_new(0x30);
    puStack_120 = (undefined1 *)0x113812;
    Node::Node(this_00,actionNum);
    puStack_120 = (undefined1 *)0x11381e;
    ppNVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mNodeMap,
                           (key_type *)
                           &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    *ppNVar4 = this_00;
  }
  puStack_120 = (undefined1 *)0x113829;
  Node::updateStrategy(this_00);
  puStack_120 = (undefined1 *)0x113831;
  __wbegin = Node::strategy(this_00);
  if (iVar3 == playerIndex) {
    infoSet.field_2._8_8_ = game;
    uVar5 = (ulong)actionNum;
    lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
    if ((int)actionNum < 1) {
      local_40 = 0.0;
    }
    else {
      local_40 = 0.0;
      uVar6 = 0;
      do {
        obj = infoSet.field_2._8_8_;
        *(undefined8 *)(local_118 + lVar1 + -8) = 0x113894;
        Kuhn::Game::Game((Game *)local_118,(Game *)obj);
        *(undefined8 *)(local_118 + lVar1 + -8) = 0x11389f;
        Kuhn::Game::step((Game *)local_118,(int)uVar6);
        *(undefined8 *)(local_118 + lVar1 + -8) = 0x1138ad;
        dVar7 = externalSamplingCFR(this,(Game *)local_118,playerIndex);
        *(double *)(local_118 + uVar6 * 8 + lVar1 + -0x118 + 0x118) = dVar7;
        local_40 = local_40 + dVar7 * __wbegin[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (0 < (int)actionNum) {
      uVar6 = 0;
      do {
        dVar7 = *(double *)(local_118 + uVar6 * 8 + lVar1 + -0x118 + 0x118);
        *(undefined8 *)(local_118 + lVar1 + -8) = 0x1139ae;
        dVar8 = Node::regretSum(this_00,(int)uVar6);
        *(undefined8 *)(local_118 + lVar1 + -8) = 0x1139c7;
        Node::regretSum(this_00,(int)uVar6,dVar8 + (dVar7 - local_40));
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  else {
    puStack_120 = (undefined1 *)0x1138e7;
    Kuhn::Game::Game((Game *)local_118,game);
    puStack_120 = (undefined1 *)0x1138ff;
    std::discrete_distribution<int>::param_type::param_type<double_const*>
              ((param_type *)(game_cp.mInfoSets[1] + 9),__wbegin,__wbegin + (int)actionNum);
    __param = game_cp.mInfoSets[1] + 9;
    puStack_120 = (undefined1 *)0x113911;
    action = std::discrete_distribution<int>::operator()
                       ((discrete_distribution<int> *)__param,&this->mEngine,(param_type *)__param);
    puStack_120 = (undefined1 *)0x11391f;
    Kuhn::Game::step((Game *)local_118,action);
    puStack_120 = (undefined1 *)0x113931;
    local_40 = externalSamplingCFR(this,(Game *)local_118,playerIndex);
    puStack_120 = (undefined1 *)0x11394a;
    Node::strategySum(this_00,__wbegin,1.0);
    if (dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      puStack_120 = (undefined1 *)0x113965;
      operator_delete(dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (game_cp._88_8_ != 0) {
      puStack_120 = (undefined1 *)0x113980;
      operator_delete((void *)game_cp._88_8_,
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - game_cp._88_8_);
    }
  }
  if (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&infoSet._M_string_length) {
    puStack_120 = (undefined1 *)0x1139ec;
    operator_delete(dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,infoSet._M_string_length + 1);
  }
  return local_40;
}

Assistant:

double Trainer<T>::externalSamplingCFR(const T &game, const int playerIndex) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // external sampling with stochastically-weighted averaging cannot treat static player
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    assert(mUpdate[player] && "External sampling with stochastically-weighted averaging cannot treat static player.");

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    node->updateStrategy();
    const double *strategy = node->strategy();

    // if current player is not the target player, sample a single action and recursively call cfr
    if (player != playerIndex) {
        auto game_cp(game);
        std::discrete_distribution<int> dist(strategy, strategy + actionNum);
        game_cp.step(dist(mEngine));
        const double util = externalSamplingCFR(game_cp, playerIndex);
        // update average strategy
        node->strategySum(strategy, 1.0);
        return util;
    }

    // for each action, recursively call cfr with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        utils[a] = externalSamplingCFR(game_cp, playerIndex);
        nodeUtil += strategy[a] * utils[a];
    }

    // for each action, compute and accumulate counterfactual regret
    for (int a = 0; a < actionNum; ++a) {
        const double regret = utils[a] - nodeUtil;
        const double regretSum = node->regretSum(a) + regret;
        node->regretSum(a, regretSum);
    }

    return nodeUtil;
}